

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O1

void __thiscall QMainWindow::removeDockWidget(QMainWindow *this,QDockWidget *dockwidget)

{
  if (dockwidget != (QDockWidget *)0x0) {
    QLayout::removeWidget
              (*(QLayout **)(*(long *)&(this->super_QWidget).field_0x8 + 0x260),
               &dockwidget->super_QWidget);
    QWidget::hide(&dockwidget->super_QWidget);
    return;
  }
  return;
}

Assistant:

void QMainWindow::removeDockWidget(QDockWidget *dockwidget)
{
    if (dockwidget) {
        d_func()->layout->removeWidget(dockwidget);
        dockwidget->hide();
    }
}